

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O1

int Bdc_ManDecompose(Bdc_Man_t *p,uint *puFunc,uint *puCare,int nVars,Vec_Ptr_t *vDivs,int nNodesMax
                    )

{
  Vec_Int_t *pVVar1;
  int iVar2;
  ulong uVar3;
  Bdc_Fun_t *pBVar4;
  long lVar5;
  Bdc_Isf_t *pIsf;
  uint uVar6;
  Bdc_Isf_t Isf;
  timespec ts_1;
  Bdc_Isf_t local_68;
  long local_50;
  Vec_Ptr_t *local_48;
  timespec local_40;
  
  local_48 = vDivs;
  iVar2 = clock_gettime(3,(timespec *)&local_68);
  if (iVar2 < 0) {
    local_50 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_68.puOn),8);
    local_50 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_68._0_8_ * -1000000;
  }
  if (p->pPars->nVarsMax < nVars) {
    __assert_fail("nVars <= p->pPars->nVarsMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcCore.c"
                  ,0x127,
                  "int Bdc_ManDecompose(Bdc_Man_t *, unsigned int *, unsigned int *, int, Vec_Ptr_t *, int)"
                 );
  }
  p->nVars = nVars;
  uVar6 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar6 = 1;
  }
  p->nWords = uVar6;
  p->nNodesMax = nNodesMax;
  Bdc_ManPrepare(p,local_48);
  if (puCare == (uint *)0x0) {
    pVVar1 = p->vMemory;
    uVar6 = p->nWords;
    uVar3 = (ulong)uVar6;
    if (uVar3 == 0) {
LAB_005c11bb:
      local_68.puOn = (uint *)0x0;
    }
    else {
      if ((int)uVar6 < 1) goto LAB_005c1441;
      lVar5 = (long)(int)uVar6 + (long)pVVar1->nSize;
      iVar2 = (int)lVar5;
      pVVar1->nSize = iVar2;
      if (pVVar1->nCap < iVar2) goto LAB_005c11bb;
      local_68.puOn = (uint *)(pVVar1->pArray + (lVar5 - uVar3));
    }
    if (uVar3 == 0) {
LAB_005c11f5:
      local_68.puOff = (uint *)0x0;
    }
    else {
      if ((int)uVar6 < 1) goto LAB_005c1441;
      lVar5 = (long)(int)uVar6 + (long)pVVar1->nSize;
      iVar2 = (int)lVar5;
      pVVar1->nSize = iVar2;
      if (pVVar1->nCap < iVar2) goto LAB_005c11f5;
      local_68.puOff = (uint *)(pVVar1->pArray + (lVar5 - uVar3));
    }
    if ((local_68.puOff == (uint *)0x0) || (local_68.puOn == (uint *)0x0)) goto LAB_005c1460;
    uVar6 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar6 = 1;
    }
    if (0 < (int)uVar6) {
      lVar5 = (ulong)uVar6 + 1;
      do {
        local_68.puOn[lVar5 + -2] = puFunc[lVar5 + -2];
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    uVar6 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar6 = 1;
    }
    if (0 < (int)uVar6) {
      lVar5 = (ulong)uVar6 + 1;
      do {
        local_68.puOff[lVar5 + -2] = ~puFunc[lVar5 + -2];
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    goto LAB_005c1365;
  }
  uVar3 = (ulong)uVar6;
  do {
    iVar2 = (int)uVar3;
    if (iVar2 < 1) goto LAB_005c1178;
    lVar5 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while (puCare[lVar5] == 0);
  if (iVar2 < 1) {
LAB_005c1178:
    p->pRoot = (Bdc_Fun_t *)((ulong)p->pNodes ^ 1);
    return 0;
  }
  pVVar1 = p->vMemory;
  uVar6 = p->nWords;
  uVar3 = (ulong)uVar6;
  if (uVar3 == 0) {
LAB_005c1171:
    local_68.puOn = (uint *)0x0;
  }
  else {
    if ((int)uVar6 < 1) goto LAB_005c1441;
    lVar5 = (long)(int)uVar6 + (long)pVVar1->nSize;
    iVar2 = (int)lVar5;
    pVVar1->nSize = iVar2;
    if (pVVar1->nCap < iVar2) goto LAB_005c1171;
    local_68.puOn = (uint *)(pVVar1->pArray + (lVar5 - uVar3));
  }
  if (uVar3 == 0) {
LAB_005c12cb:
    local_68.puOff = (uint *)0x0;
  }
  else {
    if ((int)uVar6 < 1) {
LAB_005c1441:
      local_68.uSupp = 0;
      local_68.uUniq = 0;
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar5 = (long)(int)uVar6 + (long)pVVar1->nSize;
    iVar2 = (int)lVar5;
    pVVar1->nSize = iVar2;
    if (pVVar1->nCap < iVar2) goto LAB_005c12cb;
    local_68.puOff = (uint *)(pVVar1->pArray + (lVar5 - uVar3));
  }
  if ((local_68.puOff == (uint *)0x0) || (local_68.puOn == (uint *)0x0)) {
LAB_005c1460:
    local_68.uSupp = 0;
    local_68.uUniq = 0;
    __assert_fail("pF->puOff && pF->puOn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcInt.h"
                  ,0x83,"void Bdc_IsfStart(Bdc_Man_t *, Bdc_Isf_t *)");
  }
  uVar6 = 1 << ((char)p->nVars - 5U & 0x1f);
  if (p->nVars < 6) {
    uVar6 = 1;
  }
  if (0 < (int)uVar6) {
    lVar5 = (ulong)uVar6 + 1;
    do {
      local_68.puOn[lVar5 + -2] = puFunc[lVar5 + -2] & puCare[lVar5 + -2];
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  uVar6 = 1 << ((char)p->nVars - 5U & 0x1f);
  if (p->nVars < 6) {
    uVar6 = 1;
  }
  if (0 < (int)uVar6) {
    lVar5 = (ulong)uVar6 + 1;
    do {
      local_68.puOff[lVar5 + -2] = ~puFunc[lVar5 + -2] & puCare[lVar5 + -2];
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
LAB_005c1365:
  local_68.uSupp = 0;
  local_68.uUniq = 0;
  Bdc_SuppMinimize(p,&local_68);
  pBVar4 = Bdc_ManDecompose_rec(p,&local_68);
  p->pRoot = pBVar4;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTotal = p->timeTotal + lVar5 + local_50;
  p->numCalls = p->numCalls + 1;
  p->numNodes = p->numNodes + p->nNodesNew;
  if (p->pRoot == (Bdc_Fun_t *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = Bdc_ManNodeVerify(p,&local_68,p->pRoot);
    if (iVar2 == 0) {
      puts("Bdc_ManDecompose(): Internal verification failed.");
    }
    iVar2 = p->nNodesNew;
  }
  return iVar2;
}

Assistant:

int Bdc_ManDecompose( Bdc_Man_t * p, unsigned * puFunc, unsigned * puCare, int nVars, Vec_Ptr_t * vDivs, int nNodesMax )
{
    Bdc_Isf_t Isf, * pIsf = &Isf;
    abctime clk = Abc_Clock();
    assert( nVars <= p->pPars->nVarsMax );
    // set current manager parameters
    p->nVars = nVars;
    p->nWords = Kit_TruthWordNum( nVars );
    p->nNodesMax = nNodesMax;
    Bdc_ManPrepare( p, vDivs );
    if ( puCare && Kit_TruthIsConst0( puCare, nVars ) )
    {
        p->pRoot = Bdc_Not(p->pNodes);
        return 0;
    }
    // copy the function
    Bdc_IsfStart( p, pIsf );
    if ( puCare )
    {
        Kit_TruthAnd( pIsf->puOn, puCare, puFunc, p->nVars );
        Kit_TruthSharp( pIsf->puOff, puCare, puFunc, p->nVars );
    }
    else
    {
        Kit_TruthCopy( pIsf->puOn, puFunc, p->nVars );
        Kit_TruthNot( pIsf->puOff, puFunc, p->nVars );
    }
    Bdc_SuppMinimize( p, pIsf );
    // call decomposition
    p->pRoot = Bdc_ManDecompose_rec( p, pIsf );
    p->timeTotal += Abc_Clock() - clk;
    p->numCalls++;
    p->numNodes += p->nNodesNew;
    if ( p->pRoot == NULL )
        return -1;
    if ( !Bdc_ManNodeVerify( p, pIsf, p->pRoot ) )
        printf( "Bdc_ManDecompose(): Internal verification failed.\n" );
//    assert( Bdc_ManNodeVerify( p, pIsf, p->pRoot ) );
    return p->nNodesNew;
}